

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableValue.hpp
# Opt level: O0

ConstValueRangeAccess * __thiscall
rsg::ConstValueRangeAccess::member
          (ConstValueRangeAccess *__return_storage_ptr__,ConstValueRangeAccess *this,int memberNdx)

{
  int iVar1;
  vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_> *this_00;
  const_reference this_01;
  VariableType *type;
  int offset;
  int memberNdx_local;
  ConstValueRangeAccess *this_local;
  
  iVar1 = VariableType::getMemberScalarOffset(this->m_type,memberNdx);
  this_00 = VariableType::getMembers(this->m_type);
  this_01 = std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::
            operator[](this_00,(long)memberNdx);
  type = VariableType::Member::getType(this_01);
  ConstValueRangeAccess(__return_storage_ptr__,type,this->m_min + iVar1,this->m_max + iVar1);
  return __return_storage_ptr__;
}

Assistant:

inline ConstValueRangeAccess ConstValueRangeAccess::member (int memberNdx) const
{
	int offset = m_type->getMemberScalarOffset(memberNdx);
	return ConstValueRangeAccess(m_type->getMembers()[memberNdx].getType(), m_min + offset, m_max + offset);
}